

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flute_mst.c
# Opt level: O3

Tree smergetree(Tree t1,Tree t2,int *o1,int *o2,int cx,int cy)

{
  Branch *pBVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  Branch *pBVar9;
  ulong uVar10;
  int iVar11;
  Branch *__ptr;
  long lVar12;
  long lVar13;
  int *piVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  Branch *__ptr_00;
  ulong uVar19;
  long lVar20;
  int iVar21;
  uint uVar22;
  long lVar23;
  bool bVar24;
  Tree t;
  Tree TVar25;
  int map [1000];
  int o [1000];
  int local_200c;
  int local_fd8 [1002];
  
  __ptr = t2.branch;
  uVar15 = t2._0_8_;
  __ptr_00 = t1.branch;
  uVar4 = t2.deg;
  uVar3 = t1.deg;
  TVar25.deg = (uVar4 - 1) + uVar3;
  t.length = 0;
  t.deg = TVar25.deg;
  pBVar9 = (Branch *)malloc((long)(int)(TVar25.deg * 2) * 0xc - 0x18);
  if ((int)uVar3 < 1) {
    uVar19 = 0;
  }
  else {
    piVar14 = &__ptr_00->y;
    uVar10 = 0;
    do {
      if ((((Branch *)(piVar14 + -1))->x == cx) && (uVar19 = uVar10, *piVar14 == cy)) break;
      uVar10 = uVar10 + 1;
      piVar14 = piVar14 + 3;
      uVar19 = t1._0_8_;
    } while ((uVar3 & 0x7fffffff) != uVar10);
    uVar19 = uVar19 & 0xffffffff;
  }
  iVar16 = uVar4 - 1;
  iVar21 = uVar3 * 2 + -2;
  iVar8 = __ptr_00[uVar19].n;
  if ((__ptr_00[iVar8].x != cx) || (local_200c = iVar21, __ptr_00[iVar8].y != cy)) {
    pBVar1 = __ptr_00 + uVar19;
    iVar11 = iVar16 + iVar21;
    iVar8 = pBVar1->n;
    pBVar9[iVar11].n = iVar8;
    iVar5 = pBVar1->y;
    pBVar9[iVar11].x = pBVar1->x;
    pBVar9[iVar11].y = iVar5;
    pBVar9[iVar11].n = iVar8 + iVar16;
    pBVar1->n = iVar21;
    local_200c = uVar3 * 2 + -1;
    iVar8 = iVar21;
  }
  iVar5 = uVar4 * 2 + -2;
  if ((int)uVar4 < iVar5) {
    memset(local_fd8 + (long)(int)uVar4 + -1000,0xff,(uVar15 * 4 + 0x3fffffff4 & 0x3fffffffc) + 4);
  }
  if ((int)uVar4 < 1) {
    uVar19 = 0;
  }
  else {
    piVar14 = &__ptr->y;
    uVar19 = 0;
    do {
      if ((((Branch *)(piVar14 + -1))->x == cx) && (*piVar14 == cy)) goto LAB_0012a200;
      uVar19 = uVar19 + 1;
      piVar14 = piVar14 + 3;
    } while ((uVar4 & 0x7fffffff) != uVar19);
    uVar19 = uVar15 & 0xffffffff;
  }
LAB_0012a200:
  uVar18 = (uint)uVar19;
  uVar7 = __ptr[uVar19 & 0xffffffff].n;
  uVar19 = (ulong)(int)uVar7;
  pBVar1 = __ptr + uVar19;
  if ((pBVar1->x != cx) || (uVar6 = uVar7, pBVar1->y != cy)) {
    uVar6 = uVar18;
  }
  uVar17 = pBVar1->n;
  piVar14 = &__ptr[(int)uVar17].n;
  uVar10 = (long)(int)uVar17;
  uVar22 = *piVar14;
  if (uVar17 != *piVar14) {
    do {
      uVar7 = (uint)uVar10;
      *piVar14 = (int)uVar19;
      piVar14 = &__ptr[(int)uVar22].n;
      uVar19 = uVar10 & 0xffffffff;
      bVar24 = uVar22 != *piVar14;
      uVar10 = (ulong)uVar22;
      uVar22 = *piVar14;
    } while (bVar24);
  }
  *piVar14 = uVar7;
  pBVar1->n = uVar6;
  if ((int)uVar4 < iVar5) {
    lVar12 = (long)(int)uVar4;
    do {
      if ((int)uVar6 != lVar12) {
        local_fd8[lVar12 + -1000] = local_200c;
        local_200c = local_200c + 1;
      }
      lVar12 = lVar12 + 1;
    } while (iVar5 != lVar12);
  }
  local_fd8[(long)(int)uVar6 + -1000] = iVar8;
  uVar19 = (ulong)(uVar18 == 0);
  uVar7 = 0;
  uVar17 = 0;
  do {
    iVar8 = (int)uVar19;
    if (iVar8 < (int)uVar4) {
      if ((int)uVar7 < (int)uVar3) {
        iVar11 = o1[(int)uVar7];
        iVar2 = o2[iVar8];
        pBVar1 = pBVar9 + (int)uVar17;
        if (iVar11 < iVar2) {
          iVar8 = __ptr_00[(int)uVar7].y;
          pBVar1->x = __ptr_00[(int)uVar7].x;
          pBVar1->y = iVar8;
          pBVar1->n = __ptr_00[(int)uVar7].n + iVar16;
          local_fd8[(int)uVar17] = iVar11;
          uVar7 = uVar7 + 1;
        }
        else {
          iVar11 = __ptr[iVar8].y;
          pBVar1->x = __ptr[iVar8].x;
          pBVar1->y = iVar11;
          pBVar1->n = local_fd8[(long)__ptr[iVar8].n + -1000] + iVar16;
          local_fd8[(int)uVar17] = iVar2;
          uVar19 = (ulong)(iVar8 + 2);
          if (iVar8 + 1U != uVar18) {
            uVar19 = (ulong)(iVar8 + 1U);
          }
        }
        uVar17 = uVar17 + 1;
      }
      else {
        lVar12 = (long)iVar8;
        piVar14 = &__ptr[lVar12].n;
        do {
          if ((int)uVar18 != lVar12) {
            iVar8 = ((Branch *)(piVar14 + -2))->y;
            pBVar9[(int)uVar17].x = ((Branch *)(piVar14 + -2))->x;
            pBVar9[(int)uVar17].y = iVar8;
            pBVar9[(int)uVar17].n = local_fd8[(long)*piVar14 + -1000] + iVar16;
            local_fd8[(int)uVar17] = o2[lVar12];
            uVar17 = uVar17 + 1;
          }
          lVar12 = lVar12 + 1;
          piVar14 = piVar14 + 3;
        } while ((int)uVar4 != lVar12);
        uVar19 = uVar15 & 0xffffffff;
      }
    }
    else if ((int)uVar7 < (int)uVar3) {
      lVar13 = (long)(int)uVar17;
      lVar23 = (long)(int)uVar7;
      memcpy(local_fd8 + lVar13,o1 + lVar23,(ulong)(~uVar7 + uVar3) * 4 + 4);
      lVar20 = 8;
      lVar12 = 0;
      do {
        *(undefined8 *)((long)pBVar9 + lVar20 + lVar13 * 0xc + -8) =
             *(undefined8 *)((long)__ptr_00 + lVar20 + lVar23 * 0xc + -8);
        *(int *)((long)&pBVar9[lVar13].x + lVar20) =
             *(int *)((long)&__ptr_00[lVar23].x + lVar20) + iVar16;
        lVar20 = lVar20 + 0xc;
        lVar12 = lVar12 + -1;
      } while (lVar23 - (int)uVar3 != lVar12);
      uVar17 = uVar17 - (int)lVar12;
      uVar7 = uVar3;
    }
  } while (((int)uVar7 < (int)uVar3) || ((int)uVar19 < (int)uVar4));
  if (0 < (int)uVar17) {
    memcpy(o1,local_fd8,(ulong)uVar17 << 2);
  }
  lVar12 = (long)iVar16;
  if ((int)uVar3 < iVar21) {
    lVar20 = (long)(int)uVar3 * 0xc + 8;
    lVar13 = (long)iVar21 - (long)(int)uVar3;
    do {
      *(undefined8 *)((long)pBVar9 + lVar20 + lVar12 * 0xc + -8) =
           *(undefined8 *)((long)__ptr_00 + lVar20 + -8);
      *(int *)((long)&pBVar9[lVar12].x + lVar20) = *(int *)((long)&__ptr_00->x + lVar20) + iVar16;
      lVar20 = lVar20 + 0xc;
      lVar13 = lVar13 + -1;
    } while (lVar13 != 0);
  }
  if ((int)uVar4 < iVar5) {
    lVar20 = (long)(int)uVar4;
    piVar14 = &__ptr[lVar20].n;
    do {
      if ((int)uVar6 != lVar20) {
        lVar13 = local_fd8[lVar20 + -1000] + lVar12;
        pBVar9[lVar13].n = *piVar14;
        iVar8 = ((Branch *)(piVar14 + -2))->y;
        pBVar9[lVar13].x = ((Branch *)(piVar14 + -2))->x;
        pBVar9[lVar13].y = iVar8;
        pBVar9[lVar13].n = local_fd8[(long)*piVar14 + -1000] + iVar16;
      }
      lVar20 = lVar20 + 1;
      piVar14 = piVar14 + 3;
    } while (iVar5 != lVar20);
  }
  iVar16 = iVar16 + local_200c;
  if (iVar16 < (int)(TVar25.deg * 2 + -2)) {
    iVar8 = __ptr->x;
    iVar21 = __ptr->y;
    piVar14 = &pBVar9[iVar16].n;
    iVar5 = ((uVar3 * 2 + uVar4) - local_200c) + -3;
    do {
      ((Branch *)(piVar14 + -2))->x = iVar8;
      ((Branch *)(piVar14 + -2))->y = iVar21;
      *piVar14 = iVar16;
      iVar16 = iVar16 + 1;
      piVar14 = piVar14 + 3;
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  free(__ptr_00);
  free(__ptr);
  t.branch = pBVar9;
  iVar8 = wirelength(t);
  TVar25.length = iVar8;
  TVar25.branch = pBVar9;
  return TVar25;
}

Assistant:

Tree smergetree(Tree t1, Tree t2, int *o1, int *o2,
		DTYPE cx, DTYPE cy)
{
  Tree t;
  int d, i, j, k, n, ci, cn, mapped_cn, prev, curr, next, offset;
#if MR_FOR_SMALL_CASES_ONLY
  int o[D2M+MAXPART], map[2*D2M];
#else
  int *o, *map;

  map = (int*)malloc(sizeof(int)*(t1.deg+t2.deg)*2);
  o = (int*)malloc(sizeof(int)*(t1.deg+t2.deg+MAXPART2));  
#endif

  t.deg = t1.deg + t2.deg - 1;
  t.branch = (Branch *) malloc((2*t.deg-2)*sizeof(Branch));

  offset = t2.deg - 1;
  d = t1.deg*2-2;

  for (i=0; i<t1.deg; i++) {
    if (t1.branch[i].x==cx && t1.branch[i].y==cy) {
      break;
    }
  }
  n = t1.branch[i].n;
  if (t1.branch[n].x==cx && t1.branch[n].y==cy) {
    mapped_cn = n;
  } else {
    t.branch[d+offset] = t1.branch[i];
    t.branch[d+offset].n += offset;
    t1.branch[i].n = d;
    mapped_cn = d;
    d++;
  }

  for (i=t2.deg; i<t2.deg*2-2; i++) {
    map[i] = -1;
  }
  for (i=0; i<t2.deg; i++) {
    if (t2.branch[i].x==cx && t2.branch[i].y==cy) {
      ci = i;
      break;
    }
  }

  n = t2.branch[i].n;

  if (t2.branch[n].x==cx && t2.branch[n].y==cy) {
    cn = n;
  } else {
    cn = i;
  }

  prev = n;
  curr = t2.branch[n].n;
  next = t2.branch[curr].n;
  while (curr != next) {
    t2.branch[curr].n = prev;
    prev = curr;
    curr = next;
    next = t2.branch[curr].n;
  }
  t2.branch[curr].n = prev;
  t2.branch[n].n = cn;

  for (i=t2.deg; i<2*t2.deg-2; i++) {
    if (i!=cn) {
      map[i] = d++;
    }
  }
  map[cn] = mapped_cn;

  /* merge the pin nodes in the correct order */
  j = i = k = 0;
  if (k==ci) { k++; }

  do {
    if (k>=t2.deg) {
      for (; i<t1.deg; i++) {
	t.branch[j] = t1.branch[i];
	t.branch[j].n = t1.branch[i].n + offset;
	o[j] = o1[i];
	j++;
      }
    } else if (i>=t1.deg) {
      for (; k<t2.deg; k++) {
	if (k==ci) {
	  continue;
	}
	t.branch[j] = t2.branch[k];
	n = t2.branch[k].n;
	t.branch[j].n = map[n] + offset;
	o[j] = o2[k];
	j++;
      }
    } else if (o1[i] < o2[k]) {
      t.branch[j] = t1.branch[i];
      t.branch[j].n = t1.branch[i].n + offset;
      o[j] = o1[i];
      j++;
      i++;
    } else {
      t.branch[j] = t2.branch[k];
      n = t2.branch[k].n;
      t.branch[j].n = map[n] + offset;
      o[j] = o2[k];
      j++;
      k++;
      if (k==ci) { k++; }
    }
  }while (i<t1.deg || k<t2.deg);
  //assert(j==t.deg);

  for (i=0; i<j; i++) {
    o1[i] = o[i];
  }

  for (i=t1.deg; i<t1.deg*2-2; i++) {
    t.branch[i+offset] = t1.branch[i];
    t.branch[i+offset].n = t1.branch[i].n + offset;
  }

  for (i=t2.deg; i<2*t2.deg-2; i++) {
    if (i != cn) {
      t.branch[map[i]+offset] = t2.branch[i];
      n = t2.branch[i].n;
      t.branch[map[i]+offset].n = map[n] + offset;
    }
  }

  for (i=d+offset; i<t.deg*2-2; i++) {
    t.branch[i] = t2.branch[0];
    t.branch[i].n = i;
  }

  free(t1.branch);
  free(t2.branch);

  t.length = wirelength(t);

#if !(MR_FOR_SMALL_CASES_ONLY)
  free(map); free(o);
#endif
  return t;
}